

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O3

BlockHeader * __thiscall
cfd::core::Block::GetBlockHeader(BlockHeader *__return_storage_ptr__,Block *this)

{
  uint32_t uVar1;
  
  __return_storage_ptr__->version = (this->header_).version;
  BlockHash::BlockHash(&__return_storage_ptr__->prev_block_hash,&(this->header_).prev_block_hash);
  BlockHash::BlockHash(&__return_storage_ptr__->merkle_root_hash,&(this->header_).merkle_root_hash);
  __return_storage_ptr__->nonce = (this->header_).nonce;
  uVar1 = (this->header_).bits;
  __return_storage_ptr__->time = (this->header_).time;
  __return_storage_ptr__->bits = uVar1;
  return __return_storage_ptr__;
}

Assistant:

BlockHeader Block::GetBlockHeader() const { return header_; }